

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

cmCMakePath * __thiscall
cmCMakePath::Relative(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  string local_68;
  undefined1 local_48 [8];
  path path;
  path *base_local;
  cmCMakePath *this_local;
  
  path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )base;
  std::filesystem::__cxx11::path::lexically_relative((path *)local_48);
  std::filesystem::__cxx11::path::generic_string(&local_68,(path *)local_48);
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_68,generic_format);
  std::__cxx11::string::~string((string *)&local_68);
  std::filesystem::__cxx11::path::~path((path *)local_48);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath Relative(const cm::filesystem::path& base) const
  {
    auto path = this->Path.lexically_relative(base);
    // filesystem::path:lexically_relative use preferred_separator ('\') on
    // Windows) so convert back to '/'
    return path.generic_string();
  }